

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextdocument.cpp
# Opt level: O2

void QTextDocument::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFont *font;
  qreal *pqVar1;
  PrivateShared *pPVar2;
  undefined1 *puVar3;
  qreal qVar4;
  undefined1 *puVar5;
  bool bVar6;
  byte bVar7;
  undefined1 m;
  long in_FS_OFFSET;
  undefined4 uVar8;
  undefined4 uVar9;
  QSizeF QVar10;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        contentsChange((QTextDocument *)_o,*_a[1],*_a[2],*_a[3]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        contentsChanged((QTextDocument *)_o);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        undoAvailable((QTextDocument *)_o,*_a[1]);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        redoAvailable((QTextDocument *)_o,*_a[1]);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        undoCommandAdded((QTextDocument *)_o);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        modificationChanged((QTextDocument *)_o,*_a[1]);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        cursorPositionChanged((QTextDocument *)_o,(QTextCursor *)_a[1]);
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        blockCountChanged((QTextDocument *)_o,*_a[1]);
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        baseUrlChanged((QTextDocument *)_o,(QUrl *)_a[1]);
        return;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        documentLayoutChanged((QTextDocument *)_o);
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        undo((QTextDocument *)_o);
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        redo((QTextDocument *)_o);
        return;
      }
      break;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        appendUndoItem((QTextDocument *)_o,*_a[1]);
        return;
      }
      break;
    case 0xd:
      m = *_a[1];
LAB_0045924c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_0045925f:
        setModified((QTextDocument *)_o,(bool)m);
        return;
      }
      break;
    case 0xe:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) break;
      m = true;
      goto LAB_0045925f;
    case 0xf:
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      uStack_20 = 0xaaaaaaaa;
      uStack_1c = 0xaaaaaaaa;
      local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)_o + 0x70))(&local_38,_o,*_a[1],_a[2]);
      if ((QVariant *)*_a != (QVariant *)0x0) {
        ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_38);
      }
      ::QVariant::~QVariant((QVariant *)&local_38);
    default:
      goto switchD_00458bb0_caseD_3;
    }
    goto LAB_004592d3;
  case ReadProperty:
    if (0xd < (uint)_id) break;
    pqVar1 = (qreal *)*_a;
    switch(_id) {
    case 0:
      bVar7 = *(byte *)(*(long *)(_o + 8) + 0xb8);
      goto LAB_00458fd1;
    case 1:
      bVar7 = *(byte *)(*(long *)(_o + 8) + 200);
      goto LAB_00458fd1;
    case 2:
      qVar4 = *(qreal *)(*(long *)(_o + 8) + 0x2a0);
      *pqVar1 = *(qreal *)(*(long *)(_o + 8) + 0x298);
      pqVar1[1] = qVar4;
      break;
    case 3:
      defaultFont((QTextDocument *)&local_38);
      pPVar2 = (PrivateShared *)*pqVar1;
      *pqVar1 = (qreal)local_38.shared;
      uVar8 = *(undefined4 *)(pqVar1 + 1);
      *(undefined4 *)(pqVar1 + 1) = local_38._8_4_;
      local_38._8_4_ = uVar8;
      local_38.shared = pPVar2;
      QFont::~QFont((QFont *)&local_38);
      break;
    case 4:
      *(byte *)pqVar1 = (byte)(*(uint *)(*(long *)(_o + 8) + 0x1d0) >> 0xd) & 1;
      break;
    case 5:
      bVar7 = *(byte *)(*(long *)(_o + 8) + 0x1cd);
LAB_00458fd1:
      *(byte *)pqVar1 = bVar7;
      break;
    case 6:
      QVar10 = size((QTextDocument *)_o);
      *pqVar1 = QVar10.wd;
      pqVar1[1] = QVar10.ht;
      break;
    case 7:
      uVar8 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0x298);
      uVar9 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0x298) >> 0x20);
      goto LAB_00458fb1;
    case 8:
      uVar8 = *(undefined4 *)(*(long *)(*(long *)(_o + 8) + 0x160) + 0xc);
      goto LAB_00459066;
    case 9:
      uVar8 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0x308);
      uVar9 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0x308) >> 0x20);
      goto LAB_00458fb1;
    case 10:
      defaultStyleSheet((QString *)&local_38,(QTextDocument *)_o);
      pPVar2 = (PrivateShared *)*pqVar1;
      puVar5 = (undefined1 *)pqVar1[1];
      *pqVar1 = (qreal)local_38.shared;
      pqVar1[1] = (qreal)local_38._8_8_;
      puVar3 = (undefined1 *)pqVar1[2];
      pqVar1[2] = (qreal)local_38._16_8_;
      local_38.shared = pPVar2;
      local_38._8_8_ = puVar5;
      local_38._16_8_ = puVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38);
      break;
    case 0xb:
      uVar8 = *(undefined4 *)(*(long *)(_o + 8) + 0x290);
LAB_00459066:
      *(undefined4 *)pqVar1 = uVar8;
      break;
    case 0xc:
      uVar8 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0x310);
      uVar9 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0x310) >> 0x20);
LAB_00458fb1:
      *pqVar1 = (qreal)CONCAT44(uVar9,uVar8);
      break;
    case 0xd:
      baseUrl((QTextDocument *)&local_38);
      pPVar2 = (PrivateShared *)*pqVar1;
      *pqVar1 = (qreal)local_38.shared;
      local_38.shared = pPVar2;
      QUrl::~QUrl((QUrl *)&local_38.shared);
    }
    break;
  case WriteProperty:
    if ((uint)_id < 0xe) {
      font = (QFont *)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setUndoRedoEnabled((QTextDocument *)_o,*(bool *)&(font->d).d.ptr);
          return;
        }
        break;
      case 1:
        m = *(undefined1 *)&(font->d).d.ptr;
        goto LAB_0045924c;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setPageSize((QTextDocument *)_o,(QSizeF *)font);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDefaultFont((QTextDocument *)_o,font);
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setUseDesignMetrics((QTextDocument *)_o,*(bool *)&(font->d).d.ptr);
          return;
        }
        break;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setLayoutEnabled((QTextDocument *)_o,*(bool *)&(font->d).d.ptr);
          return;
        }
        break;
      default:
        goto switchD_00458bb0_caseD_3;
      case 7:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setTextWidth((QTextDocument *)_o,(qreal)(font->d).d.ptr);
          return;
        }
        break;
      case 9:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setIndentWidth((QTextDocument *)_o,(qreal)(font->d).d.ptr);
          return;
        }
        break;
      case 10:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDefaultStyleSheet((QTextDocument *)_o,(QString *)font);
          return;
        }
        break;
      case 0xb:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setMaximumBlockCount((QTextDocument *)_o,*(int *)&(font->d).d.ptr);
          return;
        }
        break;
      case 0xc:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDocumentMargin((QTextDocument *)_o,(qreal)(font->d).d.ptr);
          return;
        }
        break;
      case 0xd:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setBaseUrl((QTextDocument *)_o,(QUrl *)font);
          return;
        }
      }
      goto LAB_004592d3;
    }
    break;
  case IndexOfMethod:
    bVar6 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(int,int,int)>
                      ((QtMocHelpers *)_a,(void **)contentsChange,0,0);
    if ((((((!bVar6) &&
           (bVar6 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)()>
                              ((QtMocHelpers *)_a,(void **)contentsChanged,0,1), !bVar6)) &&
          (bVar6 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(bool)>
                             ((QtMocHelpers *)_a,(void **)undoAvailable,0,2), !bVar6)) &&
         ((bVar6 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(bool)>
                             ((QtMocHelpers *)_a,(void **)redoAvailable,0,3), !bVar6 &&
          (bVar6 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)()>
                             ((QtMocHelpers *)_a,(void **)undoCommandAdded,0,4), !bVar6)))) &&
        ((bVar6 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(bool)>
                            ((QtMocHelpers *)_a,(void **)modificationChanged,0,5), !bVar6 &&
         ((bVar6 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(QTextCursor_const&)>
                             ((QtMocHelpers *)_a,(void **)cursorPositionChanged,0,6), !bVar6 &&
          (bVar6 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(int)>
                             ((QtMocHelpers *)_a,(void **)blockCountChanged,0,7), !bVar6)))))) &&
       (bVar6 = QtMocHelpers::indexOfMethod<void(QTextDocument::*)(QUrl_const&)>
                          ((QtMocHelpers *)_a,(void **)baseUrlChanged,0,8), !bVar6)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QTextDocument::*)()>
                  ((QtMocHelpers *)_a,(void **)documentLayoutChanged,0,9);
        return;
      }
      goto LAB_004592d3;
    }
  }
switchD_00458bb0_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_004592d3:
  __stack_chk_fail();
}

Assistant:

void QTextDocument::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTextDocument *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->contentsChange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 1: _t->contentsChanged(); break;
        case 2: _t->undoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->redoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->undoCommandAdded(); break;
        case 5: _t->modificationChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 6: _t->cursorPositionChanged((*reinterpret_cast< std::add_pointer_t<QTextCursor>>(_a[1]))); break;
        case 7: _t->blockCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->baseUrlChanged((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 9: _t->documentLayoutChanged(); break;
        case 10: _t->undo(); break;
        case 11: _t->redo(); break;
        case 12: _t->appendUndoItem((*reinterpret_cast< std::add_pointer_t<QAbstractUndoItem*>>(_a[1]))); break;
        case 13: _t->setModified((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 14: _t->setModified(); break;
        case 15: { QVariant _r = _t->loadResource((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(int , int , int )>(_a, &QTextDocument::contentsChange, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)()>(_a, &QTextDocument::contentsChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(bool )>(_a, &QTextDocument::undoAvailable, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(bool )>(_a, &QTextDocument::redoAvailable, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)()>(_a, &QTextDocument::undoCommandAdded, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(bool )>(_a, &QTextDocument::modificationChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(const QTextCursor & )>(_a, &QTextDocument::cursorPositionChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(int )>(_a, &QTextDocument::blockCountChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)(const QUrl & )>(_a, &QTextDocument::baseUrlChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextDocument::*)()>(_a, &QTextDocument::documentLayoutChanged, 9))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isUndoRedoEnabled(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isModified(); break;
        case 2: *reinterpret_cast<QSizeF*>(_v) = _t->pageSize(); break;
        case 3: *reinterpret_cast<QFont*>(_v) = _t->defaultFont(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->useDesignMetrics(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isLayoutEnabled(); break;
        case 6: *reinterpret_cast<QSizeF*>(_v) = _t->size(); break;
        case 7: *reinterpret_cast<qreal*>(_v) = _t->textWidth(); break;
        case 8: *reinterpret_cast<int*>(_v) = _t->blockCount(); break;
        case 9: *reinterpret_cast<qreal*>(_v) = _t->indentWidth(); break;
        case 10: *reinterpret_cast<QString*>(_v) = _t->defaultStyleSheet(); break;
        case 11: *reinterpret_cast<int*>(_v) = _t->maximumBlockCount(); break;
        case 12: *reinterpret_cast<qreal*>(_v) = _t->documentMargin(); break;
        case 13: *reinterpret_cast<QUrl*>(_v) = _t->baseUrl(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setUndoRedoEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setModified(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setPageSize(*reinterpret_cast<QSizeF*>(_v)); break;
        case 3: _t->setDefaultFont(*reinterpret_cast<QFont*>(_v)); break;
        case 4: _t->setUseDesignMetrics(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setLayoutEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setTextWidth(*reinterpret_cast<qreal*>(_v)); break;
        case 9: _t->setIndentWidth(*reinterpret_cast<qreal*>(_v)); break;
        case 10: _t->setDefaultStyleSheet(*reinterpret_cast<QString*>(_v)); break;
        case 11: _t->setMaximumBlockCount(*reinterpret_cast<int*>(_v)); break;
        case 12: _t->setDocumentMargin(*reinterpret_cast<qreal*>(_v)); break;
        case 13: _t->setBaseUrl(*reinterpret_cast<QUrl*>(_v)); break;
        default: break;
        }
    }
}